

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O3

void __thiscall obs::safe_list<obs::slot<int_()>_>::node::unlock(node *this,iterator *it)

{
  pthread_t pVar1;
  iterator *piVar2;
  pthread_t pVar3;
  iterator *piVar4;
  iterator **ppiVar5;
  iterator *piVar6;
  
  if (it == (iterator *)0x0) {
    __assert_fail("it",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                  ,0x1a3,
                  "void obs::safe_list<obs::slot<int ()>>::node::unlock(iterator *) [T = obs::slot<int ()>]"
                 );
  }
  pVar1 = (this->creator_thread)._M_thread;
  pVar3 = pthread_self();
  if (pVar1 == pVar3) {
    piVar2 = this->creator_thread_iterator;
    piVar4 = (iterator *)0x0;
    do {
      piVar6 = piVar4;
      piVar4 = piVar2;
      if (piVar4 == (iterator *)0x0) goto LAB_00105685;
      piVar2 = piVar4->m_next_iterator;
    } while (piVar4 != it);
    ppiVar5 = &piVar6->m_next_iterator;
    if (piVar6 == (iterator *)0x0) {
      ppiVar5 = &this->creator_thread_iterator;
    }
    *ppiVar5 = piVar4->m_next_iterator;
  }
LAB_00105685:
  if (0 < this->locks) {
    this->locks = this->locks + -1;
    return;
  }
  __assert_fail("locks > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0x1b9,
                "void obs::safe_list<obs::slot<int ()>>::node::unlock(iterator *) [T = obs::slot<int ()>]"
               );
}

Assistant:

void safe_list<T>::node::unlock(iterator* it) {
  assert(it);

  // In this case we are unlocking just one iterator, if we are in the
  // creator thread, we've to remove this iterator from the "creator
  // thread iterators" linked-list.
  if (in_creator_thread()) {
    iterator* prev = nullptr;
    iterator* next = nullptr;
    for (auto it2=creator_thread_iterator; it2; it2=next) {
      next = it2->m_next_iterator;
      if (it2 == it) {
        if (prev)
          prev->m_next_iterator = next;
        else
          creator_thread_iterator = next;

        break;
      }
      prev = it2;
    }
  }

  assert(locks > 0);
  --locks;
}